

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall wabt::interp::Memory::Memory(Memory *this,Store *param_1,MemoryType *type)

{
  uint64_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_Extern).super_Object.kind_ = Memory;
  *(undefined8 *)&(this->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Extern).super_Object.finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Extern).super_Object.host_info_ = (void *)0x0;
  (this->super_Extern).super_Object.self_.index = 0;
  (this->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Memory_001e4aa8;
  (this->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001df9d0;
  (this->type_).super_ExternType.kind = (type->super_ExternType).kind;
  (this->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e4c50;
  uVar1 = (type->limits).max;
  uVar2 = *(undefined8 *)((long)&(type->limits).max + 4);
  uVar3 = *(undefined8 *)&(type->limits).field_0x14;
  (this->type_).limits.initial = (type->limits).initial;
  (this->type_).limits.max = uVar1;
  *(undefined8 *)((long)&(this->type_).limits.max + 4) = uVar2;
  *(undefined8 *)&(this->type_).limits.field_0x14 = uVar3;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (type->limits).initial;
  this->pages_ = uVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->data_,(this->type_).page_size * uVar1);
  return;
}

Assistant:

inline Object::Object(ObjectKind kind) : kind_(kind) {}